

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O2

GLXContext __thiscall
tcu::x11::glx::GlxVisual::createContext
          (GlxVisual *this,GlxContextFactory *factory,ContextType *contextType,
          ResetNotificationStrategy resetNotificationStrategy)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  GlxDisplay *dpy;
  GLXContext p_Var4;
  ostream *poVar5;
  NotSupportedError *this_00;
  TestError *this_01;
  InternalError *this_02;
  uint uVar6;
  pointer_____offset_0x10___ *ppuVar7;
  vector<int,_std::allocator<int>_> attribs;
  uint local_1c8;
  undefined4 uStack_1c4;
  ostringstream oss;
  
  attribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  attribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  attribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dpy = this->m_display;
  iVar1 = dpy->m_majorVersion;
  iVar2 = dpy->m_minorVersion;
  if ((iVar1 != 1) || (iVar2 < 4)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,
                             "Server GLX version ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
    poVar5 = std::operator<<(poVar5,".");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5," not compatible with required version ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
    poVar5 = std::operator<<(poVar5,".");
    std::ostream::operator<<(poVar5,4);
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    NotSupportedError::NotSupportedError
              (this_00,(char *)CONCAT44(uStack_1c4,local_1c8),(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
               ,0x107);
    __cxa_throw(this_00,&NotSupportedError::typeinfo,Exception::~Exception);
  }
  checkGlxExtension(dpy,"GLX_ARB_create_context");
  checkGlxExtension(this->m_display,"GLX_ARB_create_context_profile");
  uVar3 = (contextType->super_ApiType).m_bits;
  oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = 0;
  switch(uVar3 >> 8 & 3) {
  case 0:
    checkGlxExtension(this->m_display,"GLX_EXT_create_context_es2_profile");
    oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = 4;
    break;
  case 1:
    oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = 1;
    break;
  case 2:
    oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = 2;
  }
  local_1c8 = 0x2091;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribs,(int *)&local_1c8);
  local_1c8 = uVar3 & 0xf;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribs,(int *)&local_1c8);
  local_1c8 = 0x2092;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribs,(int *)&local_1c8);
  local_1c8 = uVar3 >> 4 & 0xf;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribs,(int *)&local_1c8);
  local_1c8 = 0x9126;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribs,(int *)&local_1c8);
  std::vector<int,_std::allocator<int>_>::push_back(&attribs,(value_type_conflict1 *)&oss);
  oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = 0;
  uVar3 = (contextType->super_ApiType).m_bits;
  uVar6 = 0;
  if ((uVar3 >> 0xc & 1) != 0) {
    if ((uVar3 & 0x300) == 0) {
      this_02 = (InternalError *)__cxa_allocate_exception(0x38);
      InternalError::InternalError
                (this_02,"Only OpenGL core contexts can be forward-compatible",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
                 ,0x158);
      __cxa_throw(this_02,&InternalError::typeinfo,Exception::~Exception);
    }
    oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = 2;
    uVar6 = 2;
  }
  if ((uVar3 >> 0xb & 1) != 0) {
    uVar6 = uVar6 | 1;
    oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = uVar6;
  }
  if ((uVar3 >> 10 & 1) == 0) {
    if (uVar6 != 0) goto LAB_0091284d;
  }
  else {
    oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = uVar6 | 4;
LAB_0091284d:
    local_1c8 = 0x2094;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribs,(int *)&local_1c8);
    std::vector<int,_std::allocator<int>_>::push_back(&attribs,(value_type_conflict1 *)&oss);
  }
  if (resetNotificationStrategy != RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED) {
    if (((contextType->super_ApiType).m_bits & 0x300) == 0) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      InternalError::InternalError
                ((InternalError *)this_01,
                 "Specifying reset notification strategy is not allowed when creating OpenGL ES contexts"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
                 ,0x16d);
LAB_00912aa7:
      ppuVar7 = &InternalError::typeinfo;
      goto LAB_00912aae;
    }
    oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = 0x8256;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribs,(int *)&oss);
    if (resetNotificationStrategy == RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET) {
      oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = 0x8252;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribs,(int *)&oss);
    }
    else {
      if (resetNotificationStrategy != RESET_NOTIFICATION_STRATEGY_NO_RESET_NOTIFICATION) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        InternalError::InternalError
                  ((InternalError *)this_01,"Unknown reset notification strategy",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
                   ,0x176);
        goto LAB_00912aa7;
      }
      oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = 0x8261;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribs,(int *)&oss);
    }
  }
  oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&attribs,(int *)&oss);
  p_Var4 = (*factory->m_glXCreateContextAttribsARB)
                     ((this->m_display->super_XlibDisplay).m_display,this->m_fbConfig,
                      (GLXContext)0x0,1,
                      attribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  if (p_Var4 != (GLXContext)0x0) {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&attribs.super__Vector_base<int,_std::allocator<int>_>);
    return p_Var4;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  TestError::TestError
            (this_01,"GLX call failed",
             "factory.m_glXCreateContextAttribsARB( getXDisplay(), m_fbConfig, DE_NULL, True, &attribs[0])"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
             ,0x17d);
  ppuVar7 = &TestError::typeinfo;
LAB_00912aae:
  __cxa_throw(this_01,ppuVar7,Exception::~Exception);
}

Assistant:

GLXContext GlxVisual::createContext (const GlxContextFactory&		factory,
									 const ContextType&				contextType,
									 glu::ResetNotificationStrategy	resetNotificationStrategy)
{
	std::vector<int>	attribs;

	checkGlxVersion(m_display, 1, 4);
	checkGlxExtension(m_display, "GLX_ARB_create_context");
	checkGlxExtension(m_display, "GLX_ARB_create_context_profile");

	{
		const ApiType	apiType		= contextType.getAPI();
		int				profileMask	= 0;

		switch (apiType.getProfile())
		{
			case glu::PROFILE_ES:
				checkGlxExtension(m_display, "GLX_EXT_create_context_es2_profile");
				profileMask = GLX_CONTEXT_ES2_PROFILE_BIT_EXT;
				break;
			case glu::PROFILE_CORE:
				profileMask = GLX_CONTEXT_CORE_PROFILE_BIT_ARB;
				break;
			case glu::PROFILE_COMPATIBILITY:
				profileMask = GLX_CONTEXT_COMPATIBILITY_PROFILE_BIT_ARB;
				break;
			default:
				DE_FATAL("Impossible context profile");
		}

		attribs.push_back(GLX_CONTEXT_MAJOR_VERSION_ARB);
		attribs.push_back(apiType.getMajorVersion());
		attribs.push_back(GLX_CONTEXT_MINOR_VERSION_ARB);
		attribs.push_back(apiType.getMinorVersion());
		attribs.push_back(GLX_CONTEXT_PROFILE_MASK_ARB);
		attribs.push_back(profileMask);
	}

	// Context flags
	{
		int		flags	= 0;

		if ((contextType.getFlags() & glu::CONTEXT_FORWARD_COMPATIBLE) != 0)
		{
			if (glu::isContextTypeES(contextType))
				TCU_THROW(InternalError, "Only OpenGL core contexts can be forward-compatible");

			flags |= GLX_CONTEXT_FORWARD_COMPATIBLE_BIT_ARB;
		}

		if ((contextType.getFlags() & glu::CONTEXT_DEBUG) != 0)
			flags |= GLX_CONTEXT_DEBUG_BIT_ARB;

		if ((contextType.getFlags() & glu::CONTEXT_ROBUST) != 0)
			flags |= GLX_CONTEXT_ROBUST_ACCESS_BIT_ARB;

		if (flags != 0)
		{
			attribs.push_back(GLX_CONTEXT_FLAGS_ARB);
			attribs.push_back(flags);
		}
	}

	if (resetNotificationStrategy != glu::RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED)
	{
		if (glu::isContextTypeES(contextType))
			TCU_THROW(InternalError, "Specifying reset notification strategy is not allowed when creating OpenGL ES contexts");

		attribs.push_back(GLX_CONTEXT_RESET_NOTIFICATION_STRATEGY_ARB);

		if (resetNotificationStrategy == glu::RESET_NOTIFICATION_STRATEGY_NO_RESET_NOTIFICATION)
			attribs.push_back(GLX_NO_RESET_NOTIFICATION_ARB);
		else if (resetNotificationStrategy == glu::RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET)
			attribs.push_back(GLX_LOSE_CONTEXT_ON_RESET_ARB);
		else
			TCU_THROW(InternalError, "Unknown reset notification strategy");
	}

	// Terminate attrib list
	attribs.push_back(None);

	return TCU_CHECK_GLX(factory.m_glXCreateContextAttribsARB(
							 getXDisplay(), m_fbConfig, DE_NULL, True, &attribs[0]));
}